

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  void *pvVar1;
  uint *puVar2;
  uint *puVar3;
  int local_3c;
  int i;
  uint *pSims1;
  uint *pSims0;
  Fra_Man_t *p;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  
  pvVar1 = (pObj0->field_5).pData;
  puVar2 = Fra_ObjSim(*(Fra_Sml_t **)((long)pvVar1 + 0x38),pObj0->Id);
  puVar3 = Fra_ObjSim(*(Fra_Sml_t **)((long)pvVar1 + 0x38),pObj1->Id);
  local_3c = *(int *)(*(long *)((long)pvVar1 + 0x38) + 0x18);
  while( true ) {
    if (*(int *)(*(long *)((long)pvVar1 + 0x38) + 0x14) <= local_3c) {
      return 1;
    }
    if (puVar2[local_3c] != puVar3[local_3c]) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Fra_SmlNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Fra_ObjSim(p->pSml, pObj0->Id);
    pSims1 = Fra_ObjSim(p->pSml, pObj1->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}